

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseNat(WastParser *this,uint64_t *out_nat,bool is_64)

{
  Location loc;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  Literal *pLVar2;
  size_type sVar3;
  const_pointer pvVar4;
  undefined8 in_R9;
  string_view v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_c8 [8];
  string_view sv;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  byte local_21;
  uint64_t *puStack_20;
  bool is_64_local;
  uint64_t *out_nat_local;
  WastParser *this_local;
  
  local_21 = is_64;
  puStack_20 = out_nat;
  out_nat_local = (uint64_t *)this;
  bVar1 = PeekMatch(this,Last_Literal,0);
  if (bVar1) {
    Consume((Token *)&sv._M_str,this);
    pLVar2 = Token::literal((Token *)&sv._M_str);
    local_c8 = (undefined1  [8])(pLVar2->text)._M_len;
    sv._M_len = (size_t)(pLVar2->text)._M_str;
    v._M_str = (char *)puStack_20;
    v._M_len = sv._M_len;
    result = ParseUint64((wabt *)local_c8,v,(uint64_t *)local_c8);
    bVar1 = Failed(result);
    if ((bVar1) || (((local_21 & 1) == 0 && (0xffffffff < *puStack_20)))) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_c8);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_c8);
      loc.filename._M_str = (char *)token.loc.filename._M_len;
      loc.filename._M_len = (size_t)sv._M_str;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename._M_str;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid int \"%.*s\"",sVar3 & 0xffffffff,pvVar4,token.loc.filename._M_str,
            in_R9);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"a natural number",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
    local_50 = &local_70;
    local_48 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text._M_str + 6));
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,__l,(allocator_type *)((long)&token.field_2.literal_.text._M_str + 6));
    this_local._4_4_ = ErrorExpected(this,&local_40,"123");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text._M_str + 6));
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_110 = local_110 + -1;
      std::__cxx11::string::~string((string *)local_110);
    } while (local_110 != &local_70);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat, bool is_64) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  std::string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv, out_nat)) || (!is_64 && *out_nat > 0xffffffffu)) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}